

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O1

void * __thiscall TCMalloc_PageMap3<10>::Next(TCMalloc_PageMap3<10> *this,Number k)

{
  Node *pNVar1;
  long lVar2;
  ulong uVar3;
  void *in_RAX;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  do {
    if (0x3ff < k) {
      return (void *)0x0;
    }
    pNVar1 = (this->root_).ptrs[k >> 6];
    uVar5 = (uint)k;
    if (pNVar1 == (Node *)0x0) {
      k = (ulong)(uVar5 & 0x3c0) + 0x40;
LAB_0010e58e:
      bVar7 = true;
    }
    else {
      lVar2 = *(long *)((long)pNVar1->ptrs + (ulong)(uVar5 & 0x3c) * 2);
      if (lVar2 == 0) {
LAB_0010e584:
        k = (ulong)(uVar5 & 0x3fc) + 4;
        goto LAB_0010e58e;
      }
      pvVar4 = *(void **)(lVar2 + (ulong)(uVar5 & 3) * 8);
      uVar3 = (ulong)(uVar5 & 3);
      if (pvVar4 == (void *)0x0) {
        do {
          uVar6 = uVar3;
          pvVar4 = in_RAX;
          if (uVar6 == 3) break;
          pvVar4 = *(void **)(lVar2 + 8 + uVar6 * 8);
          uVar3 = uVar6 + 1;
        } while (pvVar4 == (void *)0x0);
        bVar7 = 2 < uVar6;
        in_RAX = pvVar4;
      }
      else {
        bVar7 = false;
        in_RAX = pvVar4;
      }
      if (bVar7) goto LAB_0010e584;
      bVar7 = false;
    }
    if (!bVar7) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> (LEAF_BITS + INTERIOR_BITS);
      const Number i2 = (k >> LEAF_BITS) & (INTERIOR_LENGTH-1);
      if (root_.ptrs[i1] == nullptr) {
        // Advance to next top-level entry
        k = (i1 + 1) << (LEAF_BITS + INTERIOR_BITS);
      } else {
        Leaf* leaf = reinterpret_cast<Leaf*>(root_.ptrs[i1]->ptrs[i2]);
        if (leaf != nullptr) {
          for (Number i3 = (k & (LEAF_LENGTH-1)); i3 < LEAF_LENGTH; i3++) {
            if (leaf->values[i3] != nullptr) {
              return leaf->values[i3];
            }
          }
        }
        // Advance to next interior entry
        k = ((k >> LEAF_BITS) + 1) << LEAF_BITS;
      }
    }
    return nullptr;
  }